

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

int __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeaveHyper(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *tol)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  int *piVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  ulong *puVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_2ac;
  cpp_dec_float<50U,_int,_void> local_2a8;
  cpp_dec_float<50U,_int,_void> local_268;
  pointer local_230;
  cpp_dec_float<50U,_int,_void> local_228;
  cpp_dec_float<50U,_int,_void> local_1e8;
  steeppr local_1a8 [8];
  uint auStack_1a0 [2];
  uint local_198 [2];
  undefined8 uStack_190;
  uint local_188 [2];
  int local_180;
  undefined1 local_17c;
  fpclass_type local_178;
  uint local_174;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  steeppr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  uint local_48 [2];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  local_230 = (pSVar2->coWeights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pnVar3 = (pSVar2->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_1e8,-1,(type *)0x0);
  ::soplex::infinity::__tls_init();
  puVar8 = (ulong *)__tls_get_addr(&PTR_003b6b60);
  local_228.fpclass = cpp_dec_float_finite;
  local_228.prec_elem = 10;
  local_228.data._M_elems[0] = 0;
  local_228.data._M_elems[1] = 0;
  local_228.data._M_elems[2] = 0;
  local_228.data._M_elems[3] = 0;
  local_228.data._M_elems[4] = 0;
  local_228.data._M_elems[5] = 0;
  local_228.data._M_elems._24_5_ = 0;
  local_228.data._M_elems[7]._1_3_ = 0;
  local_228.data._M_elems._32_5_ = 0;
  local_228.data._M_elems[9]._1_3_ = 0;
  local_228.exp = 0;
  local_228.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_228,(double)(*puVar8 ^ (ulong)DAT_00358350));
  lVar9 = (long)(this->bestPrices).super_IdxSet.num;
  if (lVar9 < 1) {
    local_2ac = -1;
  }
  else {
    lVar9 = lVar9 + 1;
    local_2ac = -1;
    do {
      iVar7 = (this->bestPrices).super_IdxSet.idx[lVar9 + -2];
      local_2a8.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar3[iVar7].m_backend.data + 0x20);
      local_2a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar7].m_backend.data;
      local_2a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[iVar7].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[iVar7].m_backend.data + 0x10);
      local_2a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar5 = *(undefined8 *)(puVar1 + 2);
      local_2a8.data._M_elems._24_5_ = SUB85(uVar5,0);
      local_2a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_2a8.exp = pnVar3[iVar7].m_backend.exp;
      local_2a8.neg = pnVar3[iVar7].m_backend.neg;
      local_2a8.fpclass = pnVar3[iVar7].m_backend.fpclass;
      local_2a8.prec_elem = pnVar3[iVar7].m_backend.prec_elem;
      local_268.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      local_268.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_268.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_268.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
      local_268.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
      local_268.exp = (tol->m_backend).exp;
      local_268.neg = (tol->m_backend).neg;
      local_268.fpclass = (tol->m_backend).fpclass;
      local_268.prec_elem = (tol->m_backend).prec_elem;
      if (local_268.data._M_elems[0] != 0 || local_268.fpclass != cpp_dec_float_finite) {
        local_268.neg = (bool)(local_268.neg ^ 1);
      }
      if ((local_268.fpclass == cpp_dec_float_NaN || local_2a8.fpclass == cpp_dec_float_NaN) ||
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_2a8,&local_268), -1 < iVar6)) {
        piVar4 = (this->bestPrices).super_IdxSet.idx;
        iVar6 = (this->bestPrices).super_IdxSet.num;
        (this->bestPrices).super_IdxSet.num = iVar6 + -1;
        piVar4[lVar9 + -2] = piVar4[(long)iVar6 + -1];
        (((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasible).data[iVar7] = 0;
      }
      else {
        uStack_50 = CONCAT35(local_2a8.data._M_elems[7]._1_3_,local_2a8.data._M_elems._24_5_);
        local_68 = (steeppr  [8])local_2a8.data._M_elems._0_8_;
        auStack_60[0] = local_2a8.data._M_elems[2];
        auStack_60[1] = local_2a8.data._M_elems[3];
        local_58[0] = local_2a8.data._M_elems[4];
        local_58[1] = local_2a8.data._M_elems[5];
        local_48[0] = local_2a8.data._M_elems[8];
        local_48[1] = local_2a8.data._M_elems[9];
        local_40 = local_2a8.exp;
        local_3c = local_2a8.neg;
        local_38 = local_2a8.fpclass;
        iStack_34 = local_2a8.prec_elem;
        local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_230[iVar7].m_backend.data;
        local_a8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&local_230[iVar7].m_backend.data + 8);
        puVar1 = (uint *)((long)&local_230[iVar7].m_backend.data + 0x10);
        local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&local_230[iVar7].m_backend.data + 0x20);
        local_a8.m_backend.exp = local_230[iVar7].m_backend.exp;
        local_a8.m_backend.neg = local_230[iVar7].m_backend.neg;
        local_a8.m_backend.fpclass = local_230[iVar7].m_backend.fpclass;
        local_a8.m_backend.prec_elem = local_230[iVar7].m_backend.prec_elem;
        local_e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 8);
        local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
        local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2)
        ;
        local_e8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 4);
        local_e8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 6);
        local_e8.m_backend.exp = (tol->m_backend).exp;
        local_e8.m_backend.neg = (tol->m_backend).neg;
        local_e8.m_backend.fpclass = (tol->m_backend).fpclass;
        local_e8.m_backend.prec_elem = (tol->m_backend).prec_elem;
        steeppr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_268,local_68,&local_a8,&local_e8,in_R8);
        local_2a8.data._M_elems[8] = local_268.data._M_elems[8];
        local_2a8.data._M_elems[9] = local_268.data._M_elems[9];
        local_2a8.data._M_elems[4] = local_268.data._M_elems[4];
        local_2a8.data._M_elems[5] = local_268.data._M_elems[5];
        local_2a8.data._M_elems._24_5_ = local_268.data._M_elems._24_5_;
        local_2a8.data._M_elems[7]._1_3_ = local_268.data._M_elems[7]._1_3_;
        local_2a8.data._M_elems[0] = local_268.data._M_elems[0];
        local_2a8.data._M_elems[1] = local_268.data._M_elems[1];
        local_2a8.data._M_elems[2] = local_268.data._M_elems[2];
        local_2a8.data._M_elems[3] = local_268.data._M_elems[3];
        local_2a8.exp = local_268.exp;
        local_2a8.neg = local_268.neg;
        local_2a8.fpclass = local_268.fpclass;
        local_2a8.prec_elem = local_268.prec_elem;
        if (((local_268.fpclass != cpp_dec_float_NaN) && (local_228.fpclass != cpp_dec_float_NaN))
           && (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_2a8,&local_228), 0 < iVar6)) {
          local_228.data._M_elems._32_5_ = local_2a8.data._M_elems._32_5_;
          local_228.data._M_elems[9]._1_3_ = local_2a8.data._M_elems[9]._1_3_;
          local_228.data._M_elems[4] = local_2a8.data._M_elems[4];
          local_228.data._M_elems[5] = local_2a8.data._M_elems[5];
          local_228.data._M_elems._24_5_ = local_2a8.data._M_elems._24_5_;
          local_228.data._M_elems[7]._1_3_ = local_2a8.data._M_elems[7]._1_3_;
          local_228.data._M_elems[0] = local_2a8.data._M_elems[0];
          local_228.data._M_elems[1] = local_2a8.data._M_elems[1];
          local_228.data._M_elems[2] = local_2a8.data._M_elems[2];
          local_228.data._M_elems[3] = local_2a8.data._M_elems[3];
          local_228.exp = local_2a8.exp;
          local_228.neg = local_2a8.neg;
          local_228.fpclass = local_2a8.fpclass;
          local_228.prec_elem = local_2a8.prec_elem;
          local_2ac = iVar7;
        }
        if (((local_2a8.fpclass == cpp_dec_float_NaN) || (local_1e8.fpclass == cpp_dec_float_NaN))
           || (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_2a8,&local_1e8), -1 < iVar7)) {
          if (local_1e8.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&local_268,0,(type *)0x0);
            iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_1e8,&local_268);
            if (iVar7 < 0) goto LAB_002c47ad;
          }
        }
        else {
LAB_002c47ad:
          local_1e8.data._M_elems[8] = local_2a8.data._M_elems[8];
          local_1e8.data._M_elems[9] = local_2a8.data._M_elems[9];
          local_1e8.data._M_elems[0] = local_2a8.data._M_elems[0];
          local_1e8.data._M_elems[1] = local_2a8.data._M_elems[1];
          local_1e8.data._M_elems[2] = local_2a8.data._M_elems[2];
          local_1e8.data._M_elems[3] = local_2a8.data._M_elems[3];
          local_1e8.data._M_elems[4] = local_2a8.data._M_elems[4];
          local_1e8.data._M_elems[5] = local_2a8.data._M_elems[5];
          local_1e8.data._M_elems[7]._1_3_ = local_2a8.data._M_elems[7]._1_3_;
          local_1e8.data._M_elems._24_5_ = local_2a8.data._M_elems._24_5_;
          local_1e8.exp = local_2a8.exp;
          local_1e8.neg = local_2a8.neg;
          local_1e8.fpclass = local_2a8.fpclass;
          local_1e8.prec_elem = local_2a8.prec_elem;
        }
      }
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  lVar9 = (long)(((this->
                  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver)->updateViols).super_IdxSet.num;
  if (0 < lVar9) {
    lVar9 = lVar9 + 1;
    do {
      pSVar2 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      iVar7 = (pSVar2->updateViols).super_IdxSet.idx[lVar9 + -2];
      if ((pSVar2->isInfeasible).data[iVar7] == 1) {
        local_2a8.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar3[iVar7].m_backend.data + 0x20)
        ;
        local_1a8 = *(steeppr (*) [8])&pnVar3[iVar7].m_backend.data;
        auStack_1a0 = *(uint (*) [2])((long)&pnVar3[iVar7].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar3[iVar7].m_backend.data + 0x10);
        local_2a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uStack_190 = *(undefined8 *)(puVar1 + 2);
        local_2a8.data._M_elems._24_5_ = SUB85(uStack_190,0);
        local_2a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_190 >> 0x28);
        local_2a8.exp = pnVar3[iVar7].m_backend.exp;
        local_2a8.neg = pnVar3[iVar7].m_backend.neg;
        local_178 = pnVar3[iVar7].m_backend.fpclass;
        local_174 = pnVar3[iVar7].m_backend.prec_elem;
        local_2a8.prec_elem = local_174;
        local_2a8.fpclass = local_178;
        local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_230[iVar7].m_backend.data;
        local_128.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&local_230[iVar7].m_backend.data + 8);
        puVar1 = (uint *)((long)&local_230[iVar7].m_backend.data + 0x10);
        local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_128.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&local_230[iVar7].m_backend.data + 0x20);
        local_128.m_backend.exp = local_230[iVar7].m_backend.exp;
        local_128.m_backend.neg = local_230[iVar7].m_backend.neg;
        local_128.m_backend.fpclass = local_230[iVar7].m_backend.fpclass;
        local_128.m_backend.prec_elem = local_230[iVar7].m_backend.prec_elem;
        local_168.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 8);
        local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
        local_168.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 2);
        local_168.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 4);
        local_168.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 6);
        local_168.m_backend.exp = (tol->m_backend).exp;
        local_168.m_backend.neg = (tol->m_backend).neg;
        local_168.m_backend.fpclass = (tol->m_backend).fpclass;
        local_168.m_backend.prec_elem = (tol->m_backend).prec_elem;
        local_198 = (uint  [2])local_2a8.data._M_elems._16_8_;
        local_188 = (uint  [2])local_2a8.data._M_elems._32_8_;
        local_180 = local_2a8.exp;
        local_17c = local_2a8.neg;
        local_2a8.data._M_elems._0_8_ = local_1a8;
        local_2a8.data._M_elems._8_8_ = auStack_1a0;
        steeppr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_268,local_1a8,&local_128,&local_168,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)local_174);
        local_2a8.data._M_elems[8] = local_268.data._M_elems[8];
        local_2a8.data._M_elems[9] = local_268.data._M_elems[9];
        local_2a8.data._M_elems[4] = local_268.data._M_elems[4];
        local_2a8.data._M_elems[5] = local_268.data._M_elems[5];
        local_2a8.data._M_elems._24_5_ = local_268.data._M_elems._24_5_;
        local_2a8.data._M_elems[7]._1_3_ = local_268.data._M_elems[7]._1_3_;
        local_2a8.data._M_elems[0] = local_268.data._M_elems[0];
        local_2a8.data._M_elems[1] = local_268.data._M_elems[1];
        local_2a8.data._M_elems[2] = local_268.data._M_elems[2];
        local_2a8.data._M_elems[3] = local_268.data._M_elems[3];
        local_2a8.exp = local_268.exp;
        local_2a8.neg = local_268.neg;
        local_2a8.fpclass = local_268.fpclass;
        local_2a8.prec_elem = local_268.prec_elem;
        if (((local_268.fpclass != cpp_dec_float_NaN) && (local_1e8.fpclass != cpp_dec_float_NaN))
           && (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_2a8,&local_1e8), 0 < iVar6)) {
          if (((local_2a8.fpclass != cpp_dec_float_NaN) && (local_228.fpclass != cpp_dec_float_NaN))
             && (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_2a8,&local_228), 0 < iVar6)) {
            local_228.data._M_elems._32_5_ = local_2a8.data._M_elems._32_5_;
            local_228.data._M_elems[9]._1_3_ = local_2a8.data._M_elems[9]._1_3_;
            local_228.data._M_elems[4] = local_2a8.data._M_elems[4];
            local_228.data._M_elems[5] = local_2a8.data._M_elems[5];
            local_228.data._M_elems._24_5_ = local_2a8.data._M_elems._24_5_;
            local_228.data._M_elems[7]._1_3_ = local_2a8.data._M_elems[7]._1_3_;
            local_228.data._M_elems[0] = local_2a8.data._M_elems[0];
            local_228.data._M_elems[1] = local_2a8.data._M_elems[1];
            local_228.data._M_elems[2] = local_2a8.data._M_elems[2];
            local_228.data._M_elems[3] = local_2a8.data._M_elems[3];
            local_228.exp = local_2a8.exp;
            local_228.neg = local_2a8.neg;
            local_228.fpclass = local_2a8.fpclass;
            local_228.prec_elem = local_2a8.prec_elem;
            local_2ac = iVar7;
          }
          (((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver)->isInfeasible).data[iVar7] = 2;
          DIdxSet::addIdx(&this->bestPrices,iVar7);
        }
      }
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  return local_2ac;
}

Assistant:

int SPxSteepPR<R>::selectLeaveHyper(R tol)
{
   const R* coPen = this->thesolver->coWeights.get_const_ptr();
   const R* fTest = this->thesolver->fTest().get_const_ptr();
   R leastBest = -1;
   R best = R(-infinity);
   R x;
   int bestIdx = -1;
   int idx = 0;

   // find the best price from the short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = fTest[idx];

      if(x < -tol)
      {
         assert(this->thesolver->isInfeasible[idx] == this->VIOLATED
                || this->thesolver->isInfeasible[idx] == this->VIOLATED_AND_CHECKED);
         x = steeppr::computePrice(x, coPen[idx], tol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            bestIdx = idx;
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // is this index a candidate for bestPrices?
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = fTest[idx];
         assert(x < -tol);
         x = steeppr::computePrice(x, coPen[idx], tol);

         if(x > leastBest)
         {
            if(x > best)
            {
               best = x;
               bestIdx = idx;
            }

            this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
            bestPrices.addIdx(idx);
         }
      }
   }

   return bestIdx;
}